

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

UniDirectionalLSTMLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_unidirectionallstm(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x1a4) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x1a4;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x50);
    UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams(this_00.unidirectionallstm_);
    (this->layer_).unidirectionallstm_ = (UniDirectionalLSTMLayerParams *)this_00;
  }
  return (UniDirectionalLSTMLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::UniDirectionalLSTMLayerParams* NeuralNetworkLayer::mutable_unidirectionallstm() {
  if (!has_unidirectionallstm()) {
    clear_layer();
    set_has_unidirectionallstm();
    layer_.unidirectionallstm_ = new ::CoreML::Specification::UniDirectionalLSTMLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.uniDirectionalLSTM)
  return layer_.unidirectionallstm_;
}